

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_list_data.cpp
# Opt level: O3

void duckdb::ArrowFixedSizeListData::Initialize
               (ArrowAppendData *result,LogicalType *type,idx_t capacity)

{
  LogicalType *type_00;
  idx_t iVar1;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
  child_buffer;
  undefined1 local_40 [16];
  pointer pLStack_30;
  
  type_00 = ArrayType::GetChildType(type);
  iVar1 = ArrayType::GetSize(type);
  local_40._8_8_ = (pointer)0x0;
  pLStack_30 = (pointer)0x0;
  ArrowAppender::InitializeChild
            ((ArrowAppender *)local_40,type_00,capacity * iVar1,&result->options,
             (shared_ptr<duckdb::ArrowTypeExtensionData,_true> *)(local_40 + 8));
  if (pLStack_30 != (pointer)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLStack_30);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>>
              *)&result->child_data,
             (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
              *)local_40);
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              local_40);
  return;
}

Assistant:

void ArrowFixedSizeListData::Initialize(ArrowAppendData &result, const LogicalType &type, idx_t capacity) {
	auto &child_type = ArrayType::GetChildType(type);
	auto array_size = ArrayType::GetSize(type);
	auto child_buffer = ArrowAppender::InitializeChild(child_type, capacity * array_size, result.options);
	result.child_data.push_back(std::move(child_buffer));
}